

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  RTCFilterFunctionN p_Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  byte bVar11;
  int iVar12;
  uint uVar13;
  undefined4 uVar14;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  long lVar19;
  Scene *pSVar20;
  undefined1 (*pauVar21) [16];
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  uint uVar55;
  uint uVar56;
  uint uVar57;
  undefined1 auVar54 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  vbool<4> valid;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_26c0 [16];
  Scene *local_26a8;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  Geometry *local_2678;
  ulong local_2670;
  ulong local_2668;
  long local_2660;
  undefined1 (*local_2658) [16];
  long local_2650;
  ulong local_2648;
  RTCFilterFunctionNArguments local_2640;
  undefined8 local_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25b0 [16];
  float local_25a0 [4];
  float local_2590 [4];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [2] [16];
  undefined1 local_2530 [16];
  undefined8 local_2520;
  undefined8 uStack_2518;
  RTCHitN local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined1 local_24c0 [16];
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  ulong uVar15;
  
  pauVar21 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar43 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar72 = ZEXT3264(CONCAT428(fVar43,CONCAT424(fVar43,CONCAT420(fVar43,CONCAT416(fVar43,CONCAT412(
                                                  fVar43,CONCAT48(fVar43,CONCAT44(fVar43,fVar43)))))
                                               )));
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23c0._4_4_ = fVar47;
  local_23c0._0_4_ = fVar47;
  local_23c0._8_4_ = fVar47;
  local_23c0._12_4_ = fVar47;
  local_23c0._16_4_ = fVar47;
  local_23c0._20_4_ = fVar47;
  local_23c0._24_4_ = fVar47;
  local_23c0._28_4_ = fVar47;
  auVar46 = ZEXT3264(local_23c0);
  fVar48 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_23e0._4_4_ = fVar48;
  local_23e0._0_4_ = fVar48;
  local_23e0._8_4_ = fVar48;
  local_23e0._12_4_ = fVar48;
  local_23e0._16_4_ = fVar48;
  local_23e0._20_4_ = fVar48;
  local_23e0._24_4_ = fVar48;
  local_23e0._28_4_ = fVar48;
  auVar51 = ZEXT3264(local_23e0);
  fVar43 = fVar43 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar47 = fVar47 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar48 = fVar48 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2648 = uVar24 ^ 0x20;
  iVar12 = (tray->tfar).field_0.i[k];
  auVar30 = ZEXT3264(CONCAT428(iVar12,CONCAT424(iVar12,CONCAT420(iVar12,CONCAT416(iVar12,CONCAT412(
                                                  iVar12,CONCAT48(iVar12,CONCAT44(iVar12,iVar12)))))
                                               )));
  local_2400._0_8_ = CONCAT44(fVar43,fVar43) ^ 0x8000000080000000;
  local_2400._8_4_ = -fVar43;
  local_2400._12_4_ = -fVar43;
  local_2400._16_4_ = -fVar43;
  local_2400._20_4_ = -fVar43;
  local_2400._24_4_ = -fVar43;
  local_2400._28_4_ = -fVar43;
  auVar54 = ZEXT3264(local_2400);
  local_2420._0_8_ = CONCAT44(fVar47,fVar47) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar47;
  local_2420._12_4_ = -fVar47;
  local_2420._16_4_ = -fVar47;
  local_2420._20_4_ = -fVar47;
  local_2420._24_4_ = -fVar47;
  local_2420._28_4_ = -fVar47;
  auVar59 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar48,fVar48) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar48;
  local_2440._12_4_ = -fVar48;
  local_2440._16_4_ = -fVar48;
  local_2440._20_4_ = -fVar48;
  local_2440._24_4_ = -fVar48;
  local_2440._28_4_ = -fVar48;
  auVar62 = ZEXT3264(local_2440);
  iVar12 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar12;
  local_2460._0_4_ = iVar12;
  local_2460._8_4_ = iVar12;
  local_2460._12_4_ = iVar12;
  local_2460._16_4_ = iVar12;
  local_2460._20_4_ = iVar12;
  local_2460._24_4_ = iVar12;
  local_2460._28_4_ = iVar12;
  auVar65 = ZEXT3264(local_2460);
  local_2658 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_01656cb4:
  do {
    do {
      if (pauVar21 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar17 = pauVar21 + -1;
      pauVar21 = pauVar21 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar17 + 8));
    uVar18 = *(ulong *)*pauVar21;
    while ((uVar18 & 8) == 0) {
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar24),auVar54._0_32_,
                                auVar72._0_32_);
      auVar37 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar23),auVar59._0_32_,
                                auVar46._0_32_);
      auVar9 = vpmaxsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar37));
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + uVar25),auVar62._0_32_,
                                auVar51._0_32_);
      auVar10 = vpmaxsd_avx2(ZEXT1632(auVar31),auVar65._0_32_);
      local_2600 = vpmaxsd_avx2(auVar9,auVar10);
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + local_2648),auVar54._0_32_,
                                auVar72._0_32_);
      auVar37 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar23 ^ 0x20)),
                                auVar59._0_32_,auVar46._0_32_);
      auVar9 = vpminsd_avx2(ZEXT1632(auVar31),ZEXT1632(auVar37));
      auVar31 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar18 + 0x40 + (uVar25 ^ 0x20)),
                                auVar62._0_32_,auVar51._0_32_);
      auVar10 = vpminsd_avx2(ZEXT1632(auVar31),auVar30._0_32_);
      auVar9 = vpminsd_avx2(auVar9,auVar10);
      auVar9 = vpcmpgtd_avx2(local_2600,auVar9);
      iVar12 = vmovmskps_avx(auVar9);
      if (iVar12 == 0xff) goto LAB_01656cb4;
      bVar11 = ~(byte)iVar12;
      uVar26 = uVar18 & 0xfffffffffffffff0;
      lVar19 = 0;
      for (uVar18 = (ulong)bVar11; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar18 = *(ulong *)(uVar26 + lVar19 * 8);
      uVar13 = bVar11 - 1 & (uint)bVar11;
      uVar15 = (ulong)uVar13;
      if (uVar13 != 0) {
        uVar55 = *(uint *)(local_2600 + lVar19 * 4);
        lVar19 = 0;
        for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          lVar19 = lVar19 + 1;
        }
        uVar13 = uVar13 - 1 & uVar13;
        uVar16 = (ulong)uVar13;
        uVar15 = *(ulong *)(uVar26 + lVar19 * 8);
        uVar56 = *(uint *)(local_2600 + lVar19 * 4);
        if (uVar13 == 0) {
          if (uVar55 < uVar56) {
            *(ulong *)*pauVar21 = uVar15;
            *(uint *)(*pauVar21 + 8) = uVar56;
            pauVar21 = pauVar21 + 1;
          }
          else {
            *(ulong *)*pauVar21 = uVar18;
            *(uint *)(*pauVar21 + 8) = uVar55;
            pauVar21 = pauVar21 + 1;
            uVar18 = uVar15;
          }
        }
        else {
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar18;
          auVar31 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar55));
          auVar37._8_8_ = 0;
          auVar37._0_8_ = uVar15;
          auVar37 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar56));
          lVar19 = 0;
          for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar13 = uVar13 - 1 & uVar13;
          uVar18 = (ulong)uVar13;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(uVar26 + lVar19 * 8);
          auVar32 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_2600 + lVar19 * 4)));
          auVar39 = vpcmpgtd_avx(auVar37,auVar31);
          if (uVar13 == 0) {
            auVar40 = vpshufd_avx(auVar39,0xaa);
            auVar39 = vblendvps_avx(auVar37,auVar31,auVar40);
            auVar31 = vblendvps_avx(auVar31,auVar37,auVar40);
            auVar37 = vpcmpgtd_avx(auVar32,auVar39);
            auVar40 = vpshufd_avx(auVar37,0xaa);
            auVar37 = vblendvps_avx(auVar32,auVar39,auVar40);
            auVar39 = vblendvps_avx(auVar39,auVar32,auVar40);
            auVar32 = vpcmpgtd_avx(auVar39,auVar31);
            auVar40 = vpshufd_avx(auVar32,0xaa);
            auVar32 = vblendvps_avx(auVar39,auVar31,auVar40);
            auVar31 = vblendvps_avx(auVar31,auVar39,auVar40);
            *pauVar21 = auVar31;
            pauVar21[1] = auVar32;
            uVar18 = auVar37._0_8_;
            pauVar21 = pauVar21 + 2;
          }
          else {
            lVar19 = 0;
            for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
              lVar19 = lVar19 + 1;
            }
            uVar13 = uVar13 - 1 & uVar13;
            uVar18 = (ulong)uVar13;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = *(ulong *)(uVar26 + lVar19 * 8);
            auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_2600 + lVar19 * 4)));
            if (uVar13 == 0) {
              auVar45 = vpshufd_avx(auVar39,0xaa);
              auVar39 = vblendvps_avx(auVar37,auVar31,auVar45);
              auVar31 = vblendvps_avx(auVar31,auVar37,auVar45);
              auVar37 = vpcmpgtd_avx(auVar40,auVar32);
              auVar45 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar40,auVar32,auVar45);
              auVar32 = vblendvps_avx(auVar32,auVar40,auVar45);
              auVar40 = vpcmpgtd_avx(auVar32,auVar31);
              auVar45 = vpshufd_avx(auVar40,0xaa);
              auVar40 = vblendvps_avx(auVar32,auVar31,auVar45);
              auVar31 = vblendvps_avx(auVar31,auVar32,auVar45);
              auVar32 = vpcmpgtd_avx(auVar37,auVar39);
              auVar45 = vpshufd_avx(auVar32,0xaa);
              auVar32 = vblendvps_avx(auVar37,auVar39,auVar45);
              auVar37 = vblendvps_avx(auVar39,auVar37,auVar45);
              auVar39 = vpcmpgtd_avx(auVar40,auVar37);
              auVar45 = vpshufd_avx(auVar39,0xaa);
              auVar39 = vblendvps_avx(auVar40,auVar37,auVar45);
              auVar37 = vblendvps_avx(auVar37,auVar40,auVar45);
              *pauVar21 = auVar31;
              pauVar21[1] = auVar37;
              pauVar21[2] = auVar39;
              uVar18 = auVar32._0_8_;
              pauVar21 = pauVar21 + 3;
            }
            else {
              *pauVar21 = auVar31;
              pauVar21[1] = auVar37;
              pauVar21[2] = auVar32;
              pauVar17 = pauVar21 + 3;
              pauVar21[3] = auVar40;
              do {
                lVar19 = 0;
                for (uVar15 = uVar18; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000)
                {
                  lVar19 = lVar19 + 1;
                }
                auVar32._8_8_ = 0;
                auVar32._0_8_ = *(ulong *)(uVar26 + lVar19 * 8);
                auVar31 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_2600 + lVar19 * 4)));
                pauVar17[1] = auVar31;
                pauVar17 = pauVar17 + 1;
                uVar18 = uVar18 - 1 & uVar18;
              } while (uVar18 != 0);
              lVar19 = 0;
              while (pauVar17 != pauVar21) {
                auVar31 = pauVar21[1];
                uVar13 = vextractps_avx(auVar31,2);
                for (lVar22 = 0x10;
                    (lVar19 != lVar22 && (*(uint *)(pauVar21[-1] + lVar22 + 8) < uVar13));
                    lVar22 = lVar22 + -0x10) {
                  *(undefined1 (*) [16])(*pauVar21 + lVar22) =
                       *(undefined1 (*) [16])(pauVar21[-1] + lVar22);
                }
                *(undefined1 (*) [16])(*pauVar21 + lVar22) = auVar31;
                lVar19 = lVar19 + -0x10;
                pauVar21 = pauVar21 + 1;
              }
              uVar18 = *(ulong *)*pauVar17;
              pauVar21 = pauVar17;
            }
          }
        }
      }
    }
    local_2650 = (ulong)((uint)uVar18 & 0xf) - 8;
    uVar18 = uVar18 & 0xfffffffffffffff0;
    for (local_2660 = 0; local_2660 != local_2650; local_2660 = local_2660 + 1) {
      lVar19 = local_2660 * 0x50;
      pSVar20 = context->scene;
      ppfVar3 = (pSVar20->vertices).items;
      pfVar4 = ppfVar3[*(uint *)(uVar18 + 0x30 + lVar19)];
      pfVar5 = ppfVar3[*(uint *)(uVar18 + 0x34 + lVar19)];
      pfVar6 = ppfVar3[*(uint *)(uVar18 + 0x38 + lVar19)];
      pfVar7 = ppfVar3[*(uint *)(uVar18 + 0x3c + lVar19)];
      auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + lVar19)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar18 + 8 + lVar19)));
      auVar31 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + lVar19)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar18 + 8 + lVar19)));
      auVar32 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + 4 + lVar19)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar18 + 0xc + lVar19)));
      auVar37 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + 4 + lVar19)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar18 + 0xc + lVar19)));
      auVar34 = vunpcklps_avx(auVar31,auVar37);
      auVar38 = vunpcklps_avx(auVar39,auVar32);
      auVar42 = vunpckhps_avx(auVar39,auVar32);
      auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 0x10 + lVar19)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar18 + 0x18 + lVar19)));
      auVar31 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 0x10 + lVar19)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar18 + 0x18 + lVar19)));
      auVar32 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + 0x14 + lVar19)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar18 + 0x1c + lVar19)));
      auVar37 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + 0x14 + lVar19)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar18 + 0x1c + lVar19)));
      auVar45 = vunpcklps_avx(auVar31,auVar37);
      auVar27 = vunpcklps_avx(auVar39,auVar32);
      auVar31 = vunpckhps_avx(auVar39,auVar32);
      auVar32 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 0x20 + lVar19)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar18 + 0x28 + lVar19)));
      auVar37 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar18 + 0x20 + lVar19)),
                              *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar18 + 0x28 + lVar19)));
      auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + 0x24 + lVar19)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar18 + 0x2c + lVar19)));
      auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar18 + 0x24 + lVar19)),
                              *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar18 + 0x2c + lVar19)));
      auVar33 = vunpcklps_avx(auVar37,auVar39);
      auVar44 = vunpcklps_avx(auVar32,auVar40);
      auVar40 = vunpckhps_avx(auVar32,auVar40);
      puVar1 = (undefined8 *)(uVar18 + 0x30 + lVar19);
      local_2520 = *puVar1;
      uStack_2518 = puVar1[1];
      puVar1 = (undefined8 *)(uVar18 + 0x40 + lVar19);
      local_2610 = *puVar1;
      uStack_2608 = puVar1[1];
      auVar37 = vsubps_avx(auVar38,auVar27);
      auVar31 = vsubps_avx(auVar42,auVar31);
      auVar39 = vsubps_avx(auVar34,auVar45);
      auVar32 = vsubps_avx(auVar44,auVar38);
      auVar40 = vsubps_avx(auVar40,auVar42);
      auVar45 = vsubps_avx(auVar33,auVar34);
      auVar27._0_4_ = auVar45._0_4_ * auVar31._0_4_;
      auVar27._4_4_ = auVar45._4_4_ * auVar31._4_4_;
      auVar27._8_4_ = auVar45._8_4_ * auVar31._8_4_;
      auVar27._12_4_ = auVar45._12_4_ * auVar31._12_4_;
      local_2570 = vfmsub231ps_fma(auVar27,auVar40,auVar39);
      auVar33._0_4_ = auVar39._0_4_ * auVar32._0_4_;
      auVar33._4_4_ = auVar39._4_4_ * auVar32._4_4_;
      auVar33._8_4_ = auVar39._8_4_ * auVar32._8_4_;
      auVar33._12_4_ = auVar39._12_4_ * auVar32._12_4_;
      local_2560 = vfmsub231ps_fma(auVar33,auVar45,auVar37);
      uVar14 = *(undefined4 *)(ray + k * 4);
      auVar63._4_4_ = uVar14;
      auVar63._0_4_ = uVar14;
      auVar63._8_4_ = uVar14;
      auVar63._12_4_ = uVar14;
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar66._4_4_ = uVar14;
      auVar66._0_4_ = uVar14;
      auVar66._8_4_ = uVar14;
      auVar66._12_4_ = uVar14;
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar69._4_4_ = uVar14;
      auVar69._0_4_ = uVar14;
      auVar69._8_4_ = uVar14;
      auVar69._12_4_ = uVar14;
      fVar43 = *(float *)(ray + k * 4 + 0x40);
      auVar58._4_4_ = fVar43;
      auVar58._0_4_ = fVar43;
      auVar58._8_4_ = fVar43;
      auVar58._12_4_ = fVar43;
      auVar38 = vsubps_avx(auVar38,auVar63);
      fVar47 = *(float *)(ray + k * 4 + 0x50);
      auVar64._4_4_ = fVar47;
      auVar64._0_4_ = fVar47;
      auVar64._8_4_ = fVar47;
      auVar64._12_4_ = fVar47;
      auVar42 = vsubps_avx(auVar42,auVar66);
      fVar48 = *(float *)(ray + k * 4 + 0x60);
      auVar67._4_4_ = fVar48;
      auVar67._0_4_ = fVar48;
      auVar67._8_4_ = fVar48;
      auVar67._12_4_ = fVar48;
      auVar34 = vsubps_avx(auVar34,auVar69);
      auVar70._0_4_ = fVar43 * auVar42._0_4_;
      auVar70._4_4_ = fVar43 * auVar42._4_4_;
      auVar70._8_4_ = fVar43 * auVar42._8_4_;
      auVar70._12_4_ = fVar43 * auVar42._12_4_;
      auVar27 = vfmsub231ps_fma(auVar70,auVar38,auVar64);
      auVar60._0_4_ = auVar45._0_4_ * auVar27._0_4_;
      auVar60._4_4_ = auVar45._4_4_ * auVar27._4_4_;
      auVar60._8_4_ = auVar45._8_4_ * auVar27._8_4_;
      auVar60._12_4_ = auVar45._12_4_ * auVar27._12_4_;
      auVar71._0_4_ = auVar39._0_4_ * auVar27._0_4_;
      auVar71._4_4_ = auVar39._4_4_ * auVar27._4_4_;
      auVar71._8_4_ = auVar39._8_4_ * auVar27._8_4_;
      auVar71._12_4_ = auVar39._12_4_ * auVar27._12_4_;
      auVar52._0_4_ = fVar48 * auVar38._0_4_;
      auVar52._4_4_ = fVar48 * auVar38._4_4_;
      auVar52._8_4_ = fVar48 * auVar38._8_4_;
      auVar52._12_4_ = fVar48 * auVar38._12_4_;
      auVar45 = vfmsub231ps_fma(auVar52,auVar34,auVar58);
      auVar39 = vfmadd231ps_fma(auVar60,auVar45,auVar40);
      auVar45 = vfmadd231ps_fma(auVar71,auVar31,auVar45);
      auVar50._0_4_ = auVar40._0_4_ * auVar37._0_4_;
      auVar50._4_4_ = auVar40._4_4_ * auVar37._4_4_;
      auVar50._8_4_ = auVar40._8_4_ * auVar37._8_4_;
      auVar50._12_4_ = auVar40._12_4_ * auVar37._12_4_;
      local_2550[0] = vfmsub231ps_fma(auVar50,auVar32,auVar31);
      auVar44._0_4_ = fVar47 * auVar34._0_4_;
      auVar44._4_4_ = fVar47 * auVar34._4_4_;
      auVar44._8_4_ = fVar47 * auVar34._8_4_;
      auVar44._12_4_ = fVar47 * auVar34._12_4_;
      auVar27 = vfmsub231ps_fma(auVar44,auVar42,auVar67);
      auVar68._0_4_ = local_2550[0]._0_4_ * fVar48;
      auVar68._4_4_ = local_2550[0]._4_4_ * fVar48;
      auVar68._8_4_ = local_2550[0]._8_4_ * fVar48;
      auVar68._12_4_ = local_2550[0]._12_4_ * fVar48;
      auVar31 = vfmadd231ps_fma(auVar68,local_2560,auVar64);
      auVar40 = vfmadd231ps_fma(auVar31,local_2570,auVar58);
      auVar53._8_4_ = 0x80000000;
      auVar53._0_8_ = 0x8000000080000000;
      auVar53._12_4_ = 0x80000000;
      auVar39 = vfmadd231ps_fma(auVar39,auVar27,auVar32);
      auVar31 = vandps_avx(auVar40,auVar53);
      uVar13 = auVar31._0_4_;
      local_2600._0_4_ = (float)(uVar13 ^ auVar39._0_4_);
      uVar55 = auVar31._4_4_;
      local_2600._4_4_ = (float)(uVar55 ^ auVar39._4_4_);
      uVar56 = auVar31._8_4_;
      local_2600._8_4_ = (float)(uVar56 ^ auVar39._8_4_);
      uVar57 = auVar31._12_4_;
      local_2600._12_4_ = (float)(uVar57 ^ auVar39._12_4_);
      auVar31 = vfmadd231ps_fma(auVar45,auVar37,auVar27);
      local_2600._16_4_ = (float)(uVar13 ^ auVar31._0_4_);
      local_2600._20_4_ = (float)(uVar55 ^ auVar31._4_4_);
      local_2600._24_4_ = (float)(uVar56 ^ auVar31._8_4_);
      local_2600._28_4_ = (float)(uVar57 ^ auVar31._12_4_);
      auVar39 = ZEXT816(0) << 0x20;
      auVar31 = vcmpps_avx(local_2600._0_16_,auVar39,5);
      auVar37 = vcmpps_avx(local_2600._16_16_,auVar39,5);
      auVar31 = vandps_avx(auVar37,auVar31);
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      local_25d0 = vandps_avx(auVar40,auVar45);
      auVar37 = vcmpps_avx(auVar40,auVar39,4);
      auVar31 = vandps_avx(auVar31,auVar37);
      auVar61._0_4_ = local_2600._0_4_ + local_2600._16_4_;
      auVar61._4_4_ = local_2600._4_4_ + local_2600._20_4_;
      auVar61._8_4_ = local_2600._8_4_ + local_2600._24_4_;
      auVar61._12_4_ = local_2600._12_4_ + local_2600._28_4_;
      auVar37 = vcmpps_avx(auVar61,local_25d0,2);
      auVar39 = auVar37 & auVar31;
      if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar39[0xf] < '\0'
         ) {
        auVar31 = vandps_avx(auVar31,auVar37);
        auVar41._0_4_ = local_2550[0]._0_4_ * auVar34._0_4_;
        auVar41._4_4_ = local_2550[0]._4_4_ * auVar34._4_4_;
        auVar41._8_4_ = local_2550[0]._8_4_ * auVar34._8_4_;
        auVar41._12_4_ = local_2550[0]._12_4_ * auVar34._12_4_;
        auVar37 = vfmadd213ps_fma(auVar42,local_2560,auVar41);
        auVar37 = vfmadd213ps_fma(auVar38,local_2570,auVar37);
        local_25e0._0_4_ = (float)(uVar13 ^ auVar37._0_4_);
        local_25e0._4_4_ = (float)(uVar55 ^ auVar37._4_4_);
        local_25e0._8_4_ = (float)(uVar56 ^ auVar37._8_4_);
        local_25e0._12_4_ = (float)(uVar57 ^ auVar37._12_4_);
        fVar43 = *(float *)(ray + k * 4 + 0x30);
        auVar38._0_4_ = local_25d0._0_4_ * fVar43;
        auVar38._4_4_ = local_25d0._4_4_ * fVar43;
        auVar38._8_4_ = local_25d0._8_4_ * fVar43;
        auVar38._12_4_ = local_25d0._12_4_ * fVar43;
        auVar37 = vcmpps_avx(auVar38,local_25e0,1);
        fVar43 = *(float *)(ray + k * 4 + 0x80);
        auVar30 = ZEXT1664(CONCAT412(fVar43,CONCAT48(fVar43,CONCAT44(fVar43,fVar43))));
        auVar42._0_4_ = fVar43 * local_25d0._0_4_;
        auVar42._4_4_ = fVar43 * local_25d0._4_4_;
        auVar42._8_4_ = fVar43 * local_25d0._8_4_;
        auVar42._12_4_ = fVar43 * local_25d0._12_4_;
        auVar39 = vcmpps_avx(local_25e0,auVar42,2);
        auVar37 = vandps_avx(auVar37,auVar39);
        auVar39 = auVar31 & auVar37;
        if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar39[0xf] < '\0') {
          local_26c0 = vandps_avx(auVar31,auVar37);
          local_25b0 = local_26c0;
          auVar31 = vrcpps_avx(local_25d0);
          auVar34._8_4_ = 0x3f800000;
          auVar34._0_8_ = 0x3f8000003f800000;
          auVar34._12_4_ = 0x3f800000;
          auVar37 = vfnmadd213ps_fma(local_25d0,auVar31,auVar34);
          auVar31 = vfmadd132ps_fma(auVar37,auVar31,auVar31);
          fVar43 = auVar31._0_4_;
          local_2580._0_4_ = fVar43 * local_25e0._0_4_;
          fVar47 = auVar31._4_4_;
          local_2580._4_4_ = fVar47 * local_25e0._4_4_;
          fVar48 = auVar31._8_4_;
          local_2580._8_4_ = fVar48 * local_25e0._8_4_;
          fVar49 = auVar31._12_4_;
          local_2580._12_4_ = fVar49 * local_25e0._12_4_;
          auVar46 = ZEXT1664(local_2580);
          local_25a0[0] = fVar43 * local_2600._0_4_;
          local_25a0[1] = fVar47 * local_2600._4_4_;
          local_25a0[2] = fVar48 * local_2600._8_4_;
          local_25a0[3] = fVar49 * local_2600._12_4_;
          auVar35._8_4_ = 0x7f800000;
          auVar35._0_8_ = 0x7f8000007f800000;
          auVar35._12_4_ = 0x7f800000;
          auVar31 = vblendvps_avx(auVar35,local_2580,local_26c0);
          local_2590[0] = fVar43 * local_2600._16_4_;
          local_2590[1] = fVar47 * local_2600._20_4_;
          local_2590[2] = fVar48 * local_2600._24_4_;
          local_2590[3] = fVar49 * local_2600._28_4_;
          auVar37 = vshufps_avx(auVar31,auVar31,0xb1);
          auVar37 = vminps_avx(auVar37,auVar31);
          auVar39 = vshufpd_avx(auVar37,auVar37,1);
          auVar37 = vminps_avx(auVar39,auVar37);
          auVar31 = vcmpps_avx(auVar31,auVar37,0);
          auVar39 = local_26c0 & auVar31;
          auVar37 = vpcmpeqd_avx(auVar37,auVar37);
          if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar39[0xf] < '\0') {
            auVar37 = auVar31;
          }
          auVar31 = vandps_avx(local_26c0,auVar37);
          uVar14 = vmovmskps_avx(auVar31);
          local_2670 = 0;
          for (uVar26 = CONCAT44((int)((ulong)ray >> 0x20),uVar14); local_26a8 = pSVar20,
              (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            local_2670 = local_2670 + 1;
          }
          do {
            local_26a0 = auVar30._0_16_;
            uVar13 = *(uint *)((long)&local_2520 + local_2670 * 4);
            uVar26 = (ulong)uVar13;
            local_2678 = (pSVar20->geometries).items[uVar26].ptr;
            if ((local_2678->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              *(undefined4 *)(local_26c0 + local_2670 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_2678->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar43 = local_25a0[local_2670];
                fVar47 = local_2590[local_2670];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2580 + local_2670 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2570 + local_2670 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2560 + local_2670 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) =
                     *(undefined4 *)(local_2550[0] + local_2670 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar43;
                *(float *)(ray + k * 4 + 0x100) = fVar47;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_2610 + local_2670 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar13;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              local_2530 = auVar46._0_16_;
              local_2480 = auVar72._0_32_;
              fVar43 = local_25a0[local_2670];
              local_24e0._4_4_ = fVar43;
              local_24e0._0_4_ = fVar43;
              local_24e0._8_4_ = fVar43;
              local_24e0._12_4_ = fVar43;
              local_24d0 = local_2590[local_2670];
              local_24b0._4_4_ = uVar13;
              local_24b0._0_4_ = uVar13;
              local_24b0._8_4_ = uVar13;
              local_24b0._12_4_ = uVar13;
              uVar14 = *(undefined4 *)((long)&local_2610 + local_2670 * 4);
              local_24c0._4_4_ = uVar14;
              local_24c0._0_4_ = uVar14;
              local_24c0._8_4_ = uVar14;
              local_24c0._12_4_ = uVar14;
              uVar14 = *(undefined4 *)(local_2570 + local_2670 * 4);
              uVar2 = *(undefined4 *)(local_2560 + local_2670 * 4);
              local_2500._4_4_ = uVar2;
              local_2500._0_4_ = uVar2;
              local_2500._8_4_ = uVar2;
              local_2500._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_2550[0] + local_2670 * 4);
              local_24f0._4_4_ = uVar2;
              local_24f0._0_4_ = uVar2;
              local_24f0._8_4_ = uVar2;
              local_24f0._12_4_ = uVar2;
              local_2510[0] = (RTCHitN)(char)uVar14;
              local_2510[1] = (RTCHitN)(char)((uint)uVar14 >> 8);
              local_2510[2] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
              local_2510[3] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
              local_2510[4] = (RTCHitN)(char)uVar14;
              local_2510[5] = (RTCHitN)(char)((uint)uVar14 >> 8);
              local_2510[6] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
              local_2510[7] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
              local_2510[8] = (RTCHitN)(char)uVar14;
              local_2510[9] = (RTCHitN)(char)((uint)uVar14 >> 8);
              local_2510[10] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
              local_2510[0xb] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
              local_2510[0xc] = (RTCHitN)(char)uVar14;
              local_2510[0xd] = (RTCHitN)(char)((uint)uVar14 >> 8);
              local_2510[0xe] = (RTCHitN)(char)((uint)uVar14 >> 0x10);
              local_2510[0xf] = (RTCHitN)(char)((uint)uVar14 >> 0x18);
              fStack_24cc = local_24d0;
              fStack_24c8 = local_24d0;
              fStack_24c4 = local_24d0;
              vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
              uStack_249c = context->user->instID[0];
              local_24a0 = uStack_249c;
              uStack_2498 = uStack_249c;
              uStack_2494 = uStack_249c;
              uStack_2490 = context->user->instPrimID[0];
              uStack_248c = uStack_2490;
              uStack_2488 = uStack_2490;
              uStack_2484 = uStack_2490;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2580 + local_2670 * 4);
              local_2690 = *local_2658;
              local_2640.valid = (int *)local_2690;
              local_2640.geometryUserPtr = local_2678->userPtr;
              local_2640.context = context->user;
              local_2640.hit = local_2510;
              local_2640.N = 4;
              local_2668 = uVar24;
              local_2640.ray = (RTCRayN *)ray;
              if (local_2678->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_2678->intersectionFilterN)(&local_2640);
              }
              if (local_2690 == (undefined1  [16])0x0) {
                auVar31 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar31 = auVar31 ^ _DAT_01f46b70;
              }
              else {
                p_Var8 = context->args->filter;
                if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_2678->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var8)(&local_2640);
                }
                auVar37 = vpcmpeqd_avx(local_2690,_DAT_01f45a50);
                auVar31 = auVar37 ^ _DAT_01f46b70;
                if (local_2690 != (undefined1  [16])0x0) {
                  auVar37 = auVar37 ^ _DAT_01f46b70;
                  auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])local_2640.hit);
                  *(undefined1 (*) [16])(local_2640.ray + 0xc0) = auVar39;
                  auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2640.hit + 0x10));
                  *(undefined1 (*) [16])(local_2640.ray + 0xd0) = auVar39;
                  auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2640.hit + 0x20));
                  *(undefined1 (*) [16])(local_2640.ray + 0xe0) = auVar39;
                  auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2640.hit + 0x30));
                  *(undefined1 (*) [16])(local_2640.ray + 0xf0) = auVar39;
                  auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2640.hit + 0x40));
                  *(undefined1 (*) [16])(local_2640.ray + 0x100) = auVar39;
                  auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2640.hit + 0x50));
                  *(undefined1 (*) [16])(local_2640.ray + 0x110) = auVar39;
                  auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2640.hit + 0x60));
                  *(undefined1 (*) [16])(local_2640.ray + 0x120) = auVar39;
                  auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2640.hit + 0x70));
                  *(undefined1 (*) [16])(local_2640.ray + 0x130) = auVar39;
                  auVar37 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2640.hit + 0x80));
                  *(undefined1 (*) [16])(local_2640.ray + 0x140) = auVar37;
                }
              }
              auVar28._8_8_ = 0x100000001;
              auVar28._0_8_ = 0x100000001;
              if ((auVar28 & auVar31) == (undefined1  [16])0x0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = local_26a0._0_4_;
              }
              else {
                local_26a0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              }
              *(undefined4 *)(local_26c0 + local_2670 * 4) = 0;
              auVar30 = ZEXT1664(local_26a0);
              uVar14 = local_26a0._0_4_;
              auVar29._4_4_ = uVar14;
              auVar29._0_4_ = uVar14;
              auVar29._8_4_ = uVar14;
              auVar29._12_4_ = uVar14;
              auVar46 = ZEXT1664(local_2530);
              auVar31 = vcmpps_avx(local_2530,auVar29,2);
              local_26c0 = vandps_avx(auVar31,local_26c0);
              auVar72 = ZEXT3264(local_2480);
              uVar26 = local_2670;
              pSVar20 = local_26a8;
              uVar24 = local_2668;
            }
            if ((((local_26c0 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (local_26c0 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (local_26c0 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < local_26c0[0xf]) break;
            auVar36._8_4_ = 0x7f800000;
            auVar36._0_8_ = 0x7f8000007f800000;
            auVar36._12_4_ = 0x7f800000;
            auVar31 = vblendvps_avx(auVar36,auVar46._0_16_,local_26c0);
            auVar37 = vshufps_avx(auVar31,auVar31,0xb1);
            auVar37 = vminps_avx(auVar37,auVar31);
            auVar39 = vshufpd_avx(auVar37,auVar37,1);
            auVar37 = vminps_avx(auVar39,auVar37);
            auVar37 = vcmpps_avx(auVar31,auVar37,0);
            auVar39 = local_26c0 & auVar37;
            auVar31 = local_26c0;
            if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar39[0xf] < '\0') {
              auVar31 = vandps_avx(auVar37,local_26c0);
            }
            uVar14 = vmovmskps_avx(auVar31);
            local_2670 = 0;
            for (uVar26 = CONCAT44((int)(uVar26 >> 0x20),uVar14); (uVar26 & 1) == 0;
                uVar26 = uVar26 >> 1 | 0x8000000000000000) {
              local_2670 = local_2670 + 1;
            }
          } while( true );
        }
      }
      auVar46 = ZEXT3264(local_23c0);
      auVar51 = ZEXT3264(local_23e0);
      auVar54 = ZEXT3264(local_2400);
      auVar59 = ZEXT3264(local_2420);
      auVar62 = ZEXT3264(local_2440);
      auVar65 = ZEXT3264(local_2460);
    }
    uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar30 = ZEXT3264(CONCAT428(uVar14,CONCAT424(uVar14,CONCAT420(uVar14,CONCAT416(uVar14,CONCAT412
                                                  (uVar14,CONCAT48(uVar14,CONCAT44(uVar14,uVar14))))
                                                  ))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }